

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O1

void duckdb::StringAggSerialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  StringAggBindData bind_data;
  undefined **local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  optional_ptr<duckdb::FunctionData,_true> local_28;
  
  local_28.ptr = bind_data_p.ptr;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&local_28);
  local_50 = &PTR__StringAggBindData_00897f50;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,*(long *)(local_28.ptr + 8),
             *(long *)(local_28.ptr + 0x10) + *(long *)(local_28.ptr + 8));
  (**(code **)(*(long *)serializer + 0x10))(serializer,100,"separator");
  (**(code **)(*(long *)serializer + 0xe0))(serializer,(string *)local_48);
  (**(code **)(*(long *)serializer + 0x18))(serializer);
  local_50 = &PTR__StringAggBindData_00897f50;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  duckdb::FunctionData::~FunctionData((FunctionData *)&local_50);
  return;
}

Assistant:

static void StringAggSerialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                               const AggregateFunction &function) {
	auto bind_data = bind_data_p->Cast<StringAggBindData>();
	serializer.WriteProperty(100, "separator", bind_data.sep);
}